

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_buffer.c
# Opt level: O0

p2sc_buffer_t * p2sc_buffer_new(guint8 *ptr,size_t len)

{
  p2sc_buffer_t *ppVar1;
  guint8 *pgVar2;
  size_t in_RSI;
  guint8 *in_RDI;
  p2sc_buffer_t *buf;
  
  ppVar1 = (p2sc_buffer_t *)g_malloc(0x28);
  ppVar1->pos = 0;
  if (in_RDI == (guint8 *)0x0) {
    pgVar2 = (guint8 *)g_malloc(0xffff);
    ppVar1->ptr = pgVar2;
    ppVar1->allen = 0xffff;
    ppVar1->len = 0;
    ppVar1->own = 1;
  }
  else {
    ppVar1->ptr = in_RDI;
    ppVar1->allen = in_RSI;
    ppVar1->len = in_RSI;
    ppVar1->own = 0;
  }
  return ppVar1;
}

Assistant:

p2sc_buffer_t *p2sc_buffer_new(guint8 *ptr, size_t len) {
    p2sc_buffer_t *buf = (p2sc_buffer_t *) g_malloc(sizeof *buf);

    buf->pos = 0;

    if (ptr) {
        buf->ptr = ptr;
        buf->allen = len;
        buf->len = len;
        buf->own = FALSE;
    } else {
        buf->ptr = (guint8 *) g_malloc(SIZBUF);
        buf->allen = SIZBUF;
        buf->len = 0;
        buf->own = TRUE;
    }

    return buf;
}